

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_cmpa_32_ai(void)

{
  uint uVar1;
  uint uVar2;
  uint res;
  uint dst;
  uint src;
  
  uVar2 = OPER_AY_AI_32();
  uVar1 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir >> 9 & 7) + 8];
  m68ki_cpu.not_z_flag = uVar1 - uVar2;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.v_flag = ((uVar2 ^ uVar1) & (m68ki_cpu.not_z_flag ^ uVar1)) >> 0x18;
  m68ki_cpu.c_flag =
       (uVar2 & m68ki_cpu.not_z_flag | (uVar1 ^ 0xffffffff) & (uVar2 | m68ki_cpu.not_z_flag)) >>
       0x17;
  return;
}

Assistant:

static void m68k_op_cmpa_32_ai(void)
{
	uint src = OPER_AY_AI_32();
	uint dst = AX;
	uint res = dst - src;

	FLAG_N = NFLAG_32(res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);
	FLAG_V = VFLAG_SUB_32(src, dst, res);
	FLAG_C = CFLAG_SUB_32(src, dst, res);
}